

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

int scroll_sub_menu_set_old_owner_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *list_value;
  undefined1 local_40 [8];
  Am_Value_List parts;
  int local_1c;
  int ret;
  Am_Object scroll_menu_widget;
  Am_Object *self_local;
  
  scroll_menu_widget.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Flags)self);
  local_1c = 0;
  bVar1 = Am_Object::Valid((Am_Object *)&stack0xffffffffffffffe8);
  if (bVar1) {
    list_value = Am_Object::Get((Am_Object *)scroll_menu_widget.data,0x82,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_40,list_value);
    local_1c = set_parts_list_commands_old_owner
                         ((Am_Value_List *)local_40,(Am_Object *)&stack0xffffffffffffffe8);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_40);
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return local_1c;
}

Assistant:

Am_Define_Formula(int, scroll_sub_menu_set_old_owner)
{
  Am_Object scroll_menu_widget = self.Get_Owner();
  int ret = 0;
  if (scroll_menu_widget.Valid()) {
    Am_Value_List parts = self.Get(Am_GRAPHICAL_PARTS);
    ret = set_parts_list_commands_old_owner(parts, scroll_menu_widget);
  }
  return ret;
}